

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O0

void __thiscall xmrig::Base::start(Base *this)

{
  bool bVar1;
  uint uVar2;
  Config *pCVar3;
  void *pvVar4;
  Api *in_RDI;
  IWatcherListener *unaff_retaddr;
  String *in_stack_00000008;
  Watcher *in_stack_00000010;
  Config *in_stack_ffffffffffffffd8;
  
  api((Base *)in_RDI);
  Api::start(in_RDI);
  config((Base *)in_RDI);
  bVar1 = Config::isShouldSave(in_stack_ffffffffffffffd8);
  if (bVar1) {
    pCVar3 = config((Base *)in_RDI);
    (*(pCVar3->super_BaseConfig).super_IConfig._vptr_IConfig[4])();
  }
  pCVar3 = config((Base *)in_RDI);
  uVar2 = (*(pCVar3->super_BaseConfig).super_IConfig._vptr_IConfig[2])();
  if ((uVar2 & 1) != 0) {
    pvVar4 = operator_new(0x30);
    pCVar3 = config((Base *)in_RDI);
    (*(pCVar3->super_BaseConfig).super_IConfig._vptr_IConfig[5])();
    Watcher::Watcher(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    *(void **)(*(long *)in_RDI->m_id + 0x28) = pvVar4;
  }
  return;
}

Assistant:

void xmrig::Base::start()
{
#   ifdef XMRIG_FEATURE_API
    api()->start();
#   endif

    if (config()->isShouldSave()) {
        config()->save();
    }

    if (config()->isWatch()) {
        d_ptr->watcher = new Watcher(config()->fileName(), this);
    }
}